

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O1

ostream * cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>
                    (ostream *strm,char *fortran_cbindings_name,char *fortran_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  int count;
  stringstream tmp_strm;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  fortran_return_type<int,_0>();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (fortran_name == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(fortran_name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,fortran_name,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  paVar1 = &local_218.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  local_1f8._M_dataplus._M_p = (pointer)((ulong)local_1f8._M_dataplus._M_p._4_4_ << 0x20);
  local_218._M_string_length = (size_type)local_1b8;
  for_each_param_helper_f<cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::{lambda(std::__cxx11::string_const&,int)#1}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_1_>
                *)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"    ","");
  wrap_line(&local_218,&local_1f8,&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (strm,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"      use iso_c_binding\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (strm,"      use bindgen_string_descriptor\n",0x24);
  local_1f8._M_dataplus._M_p = local_1f8._M_dataplus._M_p & 0xffffffff00000000;
  local_218._M_string_length = (size_type)strm;
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  for_each_param_helper_f<cpp_bindgen::_impl::fortran_param_type_from_cpp_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::{lambda(std::__cxx11::string_const&,int)#2}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::fortran_param_type_from_cpp_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_2_>
                *)&local_218);
  local_1f8._M_dataplus._M_p = local_1f8._M_dataplus._M_p & 0xffffffff00000000;
  local_218._M_string_length = (size_type)strm;
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  for_each_param_helper_f<cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::{lambda(bool,int)#1}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_1_>
                *)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>(strm,"\n",1);
  local_1f8._M_dataplus._M_p = local_1f8._M_dataplus._M_p & 0xffffffff00000000;
  local_218._M_string_length = (size_type)strm;
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  for_each_param_helper_f<cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::{lambda(bool,int)#2}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_2_>
                *)&local_218);
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  iVar2 = (int)(ostream *)&local_1a8;
  if (fortran_name == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(local_1a8 + -0x18));
  }
  else {
    sVar4 = strlen(fortran_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,fortran_name,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," = ",3);
  if (fortran_cbindings_name == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(local_1a8 + -0x18));
  }
  else {
    sVar4 = strlen(fortran_cbindings_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,fortran_cbindings_name,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
  local_1f8._M_dataplus._M_p = local_1f8._M_dataplus._M_p & 0xffffffff00000000;
  local_218._M_string_length = (size_type)local_1b8;
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  for_each_param_helper_f<cpp_bindgen::_impl::cpp_type_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::{lambda(bool,int)#3}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::cpp_type_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_3_>
                *)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"      ","");
  wrap_line(&local_218,&local_1f8,&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (strm,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    end ",8);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8.field_2._M_allocated_capacity = 0x6e6f6974636e7566;
  local_1f8._M_string_length = 8;
  local_1f8.field_2._M_local_buf[8] = '\0';
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_218.field_2._M_allocated_capacity = *psVar6;
    local_218.field_2._8_8_ = plVar5[3];
    local_218._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar6;
    local_218._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_218._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (strm,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return poVar3;
}

Assistant:

std::ostream &write_fortran_wrapper(
            std::ostream &strm, char const *fortran_cbindings_name, const char *fortran_name) {
            using CSignature = wrapped_t<CppSignature>;

            std::stringstream tmp_strm;
            tmp_strm << fortran_return_type<typename function_traits::result_type<CSignature>::type>() << " "
                     << fortran_name << "(";
            for_each_param<CSignature>(ignore_type_f{}, [&](const std::string &, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << "arg" << i;
            });
            tmp_strm << ")";
            strm << wrap_line(tmp_strm.str(), "    ");

            strm << "      use iso_c_binding\n";
            if (has_array_descriptor<CSignature>::value)
                strm << "      use bindgen_array_descriptor\n";
            if (has_string_descriptor<CSignature>::value)
                strm << "      use bindgen_string_descriptor\n";
            for_each_param<CppSignature>(fortran_param_type_from_cpp_f{}, [&](const std::string &type_name, int i) {
                strm << "      " << type_name << ", target :: arg" << i << "\n";
            });

            for_each_param<CppSignature>(
                cpp_type_array_descriptor_f{}, [&](bindgen_fortran_array_descriptor const *meta, int i) {
                    if (!meta)
                        return;
                    strm << "      type(bindgen_fortran_array_descriptor) :: descriptor" << i << "\n";
                });
            for_each_param<CppSignature>(cpp_type_string_descriptor_f{}, [&](bool is_descr, int i) {
                if (!is_descr)
                    return;
                strm << "      type(bindgen_fortran_string_descriptor) :: descriptor" << i << "\n";
            });
            strm << "\n";

            for_each_param<CppSignature>(
                cpp_type_array_descriptor_f{}, [&](bindgen_fortran_array_descriptor const *meta, int i) {
                    if (!meta)
                        return;
                    const auto var_name = "arg" + std::to_string(i);
                    const auto desc_name = "descriptor" + std::to_string(i);
                    std::string c_loc = "c_loc(" + var_name + "(";
                    for (int i = 0; i < meta->rank; ++i) {
                        if (i)
                            c_loc += ",";
                        c_loc += "lbound(" + var_name + ", " + std::to_string(i + 1) + ")";
                    }
                    c_loc += "))";
                    if (meta->is_acc_present)
                        strm << "      !$acc data present(" << var_name << ")\n"
                             << "      !$acc host_data use_device(" << var_name << ")\n";
                    strm << "      " << desc_name << "%rank = " << meta->rank << "\n"
                         << "      " << desc_name << "%type = " << meta->type << "\n"
                         << "      " << desc_name << "%dims = reshape(shape(" << var_name << "), &\n"
                         << "        shape(" << desc_name << "%dims), (/0/))\n"
                         << "      " << desc_name << "%data = " << c_loc << "\n";
                    if (meta->is_acc_present)
                        strm << "      !$acc end host_data\n"
                             << "      !$acc end data\n";
                    strm << "\n";
                });

            for_each_param<CppSignature>(cpp_type_string_descriptor_f{}, [&](bool is_descr, int i) {
                if (!is_descr)
                    return;
                strm << "      descriptor" << i << "%data = c_loc(arg" << i << ")\n"
                     << "      descriptor" << i << "%size = len(arg" << i << ")\n\n";
            });

            tmp_strm.str("");
            if (std::is_void<typename function_traits::result_type<CSignature>::type>::value) {
                tmp_strm << "call " << fortran_cbindings_name << "(";
            } else {
                tmp_strm << fortran_name << " = " << fortran_cbindings_name << "(";
            }
            for_each_param<CppSignature>(cpp_type_descriptor_f{}, [&](bool is_descriptor, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << (is_descriptor ? "descriptor" : "arg") << i;
            });
            tmp_strm << ")";
            strm << wrap_line(tmp_strm.str(), "      ");

            return strm << "    end "
                        << fortran_function_specifier<typename function_traits::result_type<CSignature>::type>() + "\n";
        }